

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLGrammarPoolImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLGrammarPoolImpl::lockPool(XMLGrammarPoolImpl *this)

{
  MemoryManager *manager;
  XMLSynchronizedStringPool *this_00;
  MemoryManager *memMgr;
  XMLGrammarPoolImpl *this_local;
  
  if ((this->fLocked & 1U) == 0) {
    this->fLocked = true;
    manager = XMLGrammarPool::getMemoryManager(&this->super_XMLGrammarPool);
    if (this->fSynchronizedStringPool == (XMLSynchronizedStringPool *)0x0) {
      this_00 = (XMLSynchronizedStringPool *)XMemory::operator_new(0x40,manager);
      XMLSynchronizedStringPool::XMLSynchronizedStringPool(this_00,this->fStringPool,0x6d,manager);
      this->fSynchronizedStringPool = this_00;
    }
    if ((this->fXSModelIsValid & 1U) == 0) {
      (*(this->super_XMLGrammarPool)._vptr_XMLGrammarPool[0x11])();
    }
  }
  return;
}

Assistant:

void XMLGrammarPoolImpl::lockPool()
{
    if (!fLocked)
    {
        fLocked = true;
        MemoryManager *memMgr = getMemoryManager();
        if(!fSynchronizedStringPool)
        {
            fSynchronizedStringPool = new (memMgr) XMLSynchronizedStringPool(fStringPool, 109, memMgr);
        }
        if (!fXSModelIsValid)
        {
            createXSModel();
        }
    }
}